

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAuto.c
# Opt level: O1

void Abc_NtkAutoPrint(Abc_Ntk_t *pNtk,int Output,int fNaive,int fVerbose)

{
  int iVar1;
  DdManager *dd;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  uint *__ptr;
  Vec_Ptr_t *pVVar10;
  undefined8 uVar11;
  char **__ptr_00;
  DdNode *pDVar12;
  DdNode *pDVar13;
  DdNode *pDVar14;
  DdNode *pDVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  timespec ts;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  long local_70;
  timespec local_50;
  char **local_40;
  DdNode *local_38;
  
  pvVar9 = Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,fVerbose);
  if (pvVar9 != (void *)0x0) {
    if (pNtk->vAttrs->nSize < 8) {
LAB_00294ec7:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar7 = pNtk->vCis->nSize;
    uVar8 = pNtk->vCos->nSize;
    dd = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
    __ptr = (uint *)malloc(0x10);
    uVar4 = 8;
    if (6 < uVar8 - 1) {
      uVar4 = uVar8;
    }
    __ptr[1] = 0;
    *__ptr = uVar4;
    if (uVar4 == 0) {
      pvVar9 = (void *)0x0;
    }
    else {
      pvVar9 = malloc((long)(int)uVar4 << 3);
    }
    *(void **)(__ptr + 2) = pvVar9;
    pVVar10 = pNtk->vCos;
    if (0 < pVVar10->nSize) {
      lVar20 = 0;
      do {
        lVar19 = *(long *)(*pVVar10->pArray[lVar20] + 0x1b0);
        if (*(int *)(lVar19 + 4) < 8) goto LAB_00294ec7;
        piVar2 = *(int **)(*(long *)(lVar19 + 8) + 0x38);
        if (*(void **)(piVar2 + 2) == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar6 = (int)*(long *)((long)pVVar10->pArray[lVar20] + 0x10);
        lVar19 = (long)iVar6;
        iVar1 = *piVar2;
        if (iVar1 <= iVar6) {
          iVar16 = iVar6 + 10;
          if (iVar6 < iVar1 * 2) {
            iVar16 = iVar1 * 2;
          }
          if (iVar1 < iVar16) {
            pvVar9 = realloc(*(void **)(piVar2 + 2),(long)iVar16 * 8);
            *(void **)(piVar2 + 2) = pvVar9;
            memset((void *)((long)pvVar9 + (long)*piVar2 * 8),0,((long)iVar16 - (long)*piVar2) * 8);
            *piVar2 = iVar16;
          }
        }
        if ((*(long *)(*(long *)(piVar2 + 2) + lVar19 * 8) == 0) &&
           (*(code **)(piVar2 + 8) != (code *)0x0)) {
          uVar11 = (**(code **)(piVar2 + 8))(*(undefined8 *)(piVar2 + 4));
          *(undefined8 *)(*(long *)(piVar2 + 2) + lVar19 * 8) = uVar11;
        }
        uVar11 = *(undefined8 *)(*(long *)(piVar2 + 2) + lVar19 * 8);
        uVar4 = __ptr[1];
        uVar5 = *__ptr;
        if (uVar4 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar18 = 0x10;
          }
          else {
            uVar18 = uVar5 * 2;
            if ((int)uVar18 <= (int)uVar5) goto LAB_002949c9;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc((ulong)uVar5 << 4);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar5 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar9;
          *__ptr = uVar18;
        }
LAB_002949c9:
        __ptr[1] = uVar4 + 1;
        *(undefined8 *)(*(long *)(__ptr + 2) + (long)(int)uVar4 * 8) = uVar11;
        lVar20 = lVar20 + 1;
        pVVar10 = pNtk->vCos;
      } while (lVar20 < pVVar10->nSize);
    }
    pvVar9 = *(void **)(__ptr + 2);
    local_40 = Abc_NtkCollectCioNames(pNtk,0);
    __ptr_00 = Abc_NtkCollectCioNames(pNtk,1);
    if (fVerbose != 0) {
      uVar4 = Cudd_ReadKeys(dd);
      uVar5 = Cudd_ReadDead(dd);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar4 - uVar5));
    }
    uVar17 = (ulong)uVar7;
    if (0 < (int)uVar7) {
      do {
        Cudd_bddNewVar(dd);
        uVar4 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar4;
      } while (uVar4 != 0);
    }
    iVar6 = Cudd_ReadSize(dd);
    if (iVar6 != uVar7 * 2) {
      __assert_fail("Cudd_ReadSize(dd) == 2 * nInputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcAuto.c"
                    ,0x5b,"void Abc_NtkAutoPrint(Abc_Ntk_t *, int, int, int)");
    }
    Cudd_zddVarsFromBddVars(dd,2);
    if (Output == -1) {
      iVar6 = clock_gettime(3,&local_50);
      if (iVar6 < 0) {
        local_70 = 1;
      }
      else {
        lVar20 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
        local_70 = ((lVar20 >> 7) - (lVar20 >> 0x3f)) + local_50.tv_sec * -1000000;
      }
      if ((int)uVar8 < 1) {
        local_94 = 0;
        local_a0 = 0;
        local_9c = 0;
        local_98 = 0;
        local_a4 = 0;
      }
      else {
        uVar17 = 0;
        local_a4 = 0;
        local_98 = 0;
        local_9c = 0;
        local_a0 = 0;
        local_94 = 0;
        do {
          pDVar12 = *(DdNode **)((long)pvVar9 + uVar17 * 8);
          pDVar12 = Extra_bddSpaceFromFunction(dd,pDVar12,pDVar12);
          Cudd_Ref(pDVar12);
          pDVar13 = Extra_bddSpaceCanonVars(dd,pDVar12);
          Cudd_Ref(pDVar13);
          local_38 = Extra_bddSpaceReduce(dd,*(DdNode **)((long)pvVar9 + uVar17 * 8),pDVar13);
          Cudd_Ref(local_38);
          pDVar14 = Extra_bddSpaceEquations(dd,pDVar12);
          Cudd_Ref(pDVar14);
          uVar4 = Cudd_SupportSize(dd,pDVar12);
          dVar21 = Cudd_CountMinterm(dd,pDVar12,uVar4);
          uVar5 = Extra_Base2LogDouble(dVar21);
          printf("Output #%3d: Inputs = %2d. AutoK = %2d.\n",uVar17 & 0xffffffff,(ulong)uVar4,
                 (ulong)uVar5);
          if (0 < (int)uVar5) {
            local_98 = local_98 + 1;
            local_94 = local_94 + uVar5;
            uVar18 = local_a0;
            if ((int)local_a0 <= (int)uVar5) {
              uVar18 = uVar5;
            }
            bVar3 = (int)local_a0 < (int)uVar5;
            local_a0 = uVar18;
            if (bVar3) {
              local_9c = uVar4;
            }
          }
          if ((int)local_a4 <= (int)uVar4) {
            local_a4 = uVar4;
          }
          pDVar15 = Extra_bddSpaceFromMatrixPos(dd,pDVar14);
          Cudd_Ref(pDVar15);
          if (pDVar12 != pDVar15) {
            puts("Spaces are NOT EQUAL!");
          }
          Cudd_RecursiveDeref(dd,pDVar12);
          Cudd_RecursiveDeref(dd,pDVar15);
          Cudd_RecursiveDeref(dd,pDVar13);
          Cudd_RecursiveDeref(dd,local_38);
          Cudd_RecursiveDerefZdd(dd,pDVar14);
          uVar17 = uVar17 + 1;
        } while (uVar8 != uVar17);
      }
      puts("The cumulative statistics for all outputs:");
      printf("Ins=%3d ",(ulong)uVar7);
      printf("InMax=%3d   ",(ulong)local_a4);
      printf("Outs=%3d ",(ulong)uVar8);
      printf("Auto=%3d   ",(ulong)local_98);
      printf("SumK=%3d ",(ulong)local_94);
      printf("KMax=%2d ",(ulong)local_a0);
      printf("Supp=%3d   ",(ulong)local_9c);
      iVar6 = clock_gettime(3,&local_50);
      if (iVar6 < 0) {
        lVar20 = -1;
      }
      else {
        lVar20 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      printf("Time=%4.2f ",(double)((float)(lVar20 + local_70) / 1e+06));
      putchar(10);
    }
    else {
      pDVar12 = Extra_bddSpaceFromFunctionFast(dd,*(DdNode **)((long)pvVar9 + (long)Output * 8));
      Cudd_Ref(pDVar12);
      pDVar13 = Extra_bddSpaceCanonVars(dd,pDVar12);
      Cudd_Ref(pDVar13);
      pDVar14 = Extra_bddSpaceReduce(dd,*(DdNode **)((long)pvVar9 + (long)Output * 8),pDVar13);
      Cudd_Ref(pDVar14);
      pDVar15 = Extra_bddSpaceEquations(dd,pDVar12);
      Cudd_Ref(pDVar15);
      uVar7 = Cudd_SupportSize(dd,pDVar12);
      dVar21 = Cudd_CountMinterm(dd,pDVar12,uVar7);
      uVar8 = Extra_Base2LogDouble(dVar21);
      printf("Output #%3d: Inputs = %2d. AutoK = %2d.\n",(ulong)(uint)Output,(ulong)uVar7,
             (ulong)uVar8);
      Cudd_RecursiveDeref(dd,pDVar12);
      Cudd_RecursiveDeref(dd,pDVar13);
      Cudd_RecursiveDeref(dd,pDVar14);
      Cudd_RecursiveDerefZdd(dd,pDVar15);
    }
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (local_40 != (char **)0x0) {
      free(local_40);
    }
    if (__ptr_00 != (char **)0x0) {
      free(__ptr_00);
    }
    if (pvVar9 != (void *)0x0) {
      free(pvVar9);
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
  }
  return;
}

Assistant:

void Abc_NtkAutoPrint( Abc_Ntk_t * pNtk, int Output, int fNaive, int fVerbose )
{
    DdManager * dd;         // the BDD manager used to hold shared BDDs
    DdNode ** pbGlobal;     // temporary storage for global BDDs
    char ** pInputNames;    // pointers to the CI names
    char ** pOutputNames;   // pointers to the CO names
    int nOutputs, nInputs, i;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;

    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, 10000000, 1, 1, 0, fVerbose) == NULL )
        return;

    // get information about the network
    nInputs  = Abc_NtkCiNum(pNtk);
    nOutputs = Abc_NtkCoNum(pNtk);
//    dd       = pNtk->pManGlob;
    dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    pbGlobal = (DdNode **)Vec_PtrArray( vFuncsGlob );

    // get the network names
    pInputNames = Abc_NtkCollectCioNames( pNtk, 0 );
    pOutputNames = Abc_NtkCollectCioNames( pNtk, 1 );

    // print the size of the BDDs
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // allocate additional variables
    for ( i = 0; i < nInputs; i++ )
        Cudd_bddNewVar( dd );
    assert( Cudd_ReadSize(dd) == 2 * nInputs );

    // create ZDD variables in the manager
    Cudd_zddVarsFromBddVars( dd, 2 );

    // perform the analysis of the primary output functions for auto-symmetry
    if ( Output == -1 )
        Abc_NtkAutoPrintAll( dd, nInputs, pbGlobal, nOutputs, pInputNames, pOutputNames, fNaive );
    else
        Abc_NtkAutoPrintOne( dd, nInputs, pbGlobal, Output, pInputNames, pOutputNames, fNaive );

    // deref the PO functions
//    Abc_NtkFreeGlobalBdds( pNtk );
    // stop the global BDD manager
//    Extra_StopManager( pNtk->pManGlob );
//    pNtk->pManGlob = NULL;
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    ABC_FREE( pInputNames );
    ABC_FREE( pOutputNames );
    Vec_PtrFree( vFuncsGlob );
}